

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

void ctemplate::anon_unknown_14::WriteOneHeaderEntry
               (string *outstring,string *variable,string *full_pathname)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  size_type sVar6;
  long lVar7;
  ostream *poVar8;
  mapped_type *pmVar9;
  string local_288 [32];
  ostringstream local_268 [8];
  ostringstream outstream;
  TemplateString local_f0;
  TemplateId local_d0;
  TemplateId id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  ulong local_68;
  size_type i;
  ctemplate local_58 [7];
  bool take_next;
  string filename;
  MutexLock local_28;
  MutexLock ml;
  string *full_pathname_local;
  string *variable_local;
  string *outstring_local;
  
  ml.mu_ = (Mutex *)full_pathname;
  MutexLock::MutexLock(&local_28,(Mutex *)(anonymous_namespace)::g_header_mutex);
  if (((anonymous_namespace)::
       WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
       ::vars_seen_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                   ::vars_seen_abi_cxx11_), iVar3 != 0)) {
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_ctemplate::StringHash,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::unordered_map(&(anonymous_namespace)::
                     WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                     ::vars_seen_abi_cxx11_);
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_ctemplate::StringHash,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 ::~unordered_map,
                 &(anonymous_namespace)::
                  WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                  ::vars_seen_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                         ::vars_seen_abi_cxx11_);
  }
  if (((anonymous_namespace)::
       WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
       ::current_file_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                   ::current_file_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::string::string
              ((string *)
               (anonymous_namespace)::
               WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
               ::current_file_abi_cxx11_);
    __cxa_atexit(std::__cxx11::string::~string,
                 (anonymous_namespace)::
                 WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                 ::current_file_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                         ::current_file_abi_cxx11_);
  }
  if (((anonymous_namespace)::
       WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
       ::prefix_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                   ::prefix_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::string::string
              ((string *)
               (anonymous_namespace)::
               WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
               ::prefix_abi_cxx11_);
    __cxa_atexit(std::__cxx11::string::~string,
                 (anonymous_namespace)::
                 WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                 ::prefix_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                         ::prefix_abi_cxx11_);
  }
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ml.mu_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(anonymous_namespace)::
                                    WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                    ::current_file_abi_cxx11_);
  if (bVar2) {
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_ctemplate::StringHash,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::clear(&(anonymous_namespace)::
             WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
             ::vars_seen_abi_cxx11_);
    std::__cxx11::string::operator=
              ((string *)
               (anonymous_namespace)::
               WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
               ::current_file_abi_cxx11_,(string *)ml.mu_);
    Basename(local_58,(string *)ml.mu_);
    std::__cxx11::string::operator=
              ((string *)
               (anonymous_namespace)::
               WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
               ::prefix_abi_cxx11_,"k");
    i._7_1_ = 1;
    local_68 = 0;
    do {
      uVar1 = local_68;
      uVar4 = std::__cxx11::string::length();
      if ((uVar4 <= uVar1) ||
         (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_58), *pcVar5 == '.'))
      goto LAB_0014ca17;
      if ((i._7_1_ & 1) != 0) {
        std::__cxx11::string::substr((ulong)local_88,(ulong)local_58);
        bVar2 = std::operator==(local_88,"post");
        std::__cxx11::string::~string((string *)local_88);
        if (bVar2) goto LAB_0014ca17;
        std::__cxx11::string::operator[]((ulong)local_58);
        std::operator+(local_a8,'\x10');
        std::__cxx11::string::operator=
                  ((string *)
                   (anonymous_namespace)::
                   WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                   ::prefix_abi_cxx11_,(string *)local_a8);
        std::__cxx11::string::~string((string *)local_a8);
        i._7_1_ = 0;
      }
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
      if (*pcVar5 == '_') {
        i._7_1_ = 1;
      }
      local_68 = local_68 + 1;
    } while( true );
  }
LAB_0014ca6b:
  sVar6 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_ctemplate::StringHash,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::count(&(anonymous_namespace)::
                   WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                   ::vars_seen_abi_cxx11_,variable);
  if (sVar6 == 0) {
    bVar2 = std::operator==(variable,"__{{MAIN}}__");
    if ((!bVar2) && (lVar7 = std::__cxx11::string::find((char *)variable,0x187c18), lVar7 != 0)) {
      TemplateString::TemplateString(&local_f0,variable);
      local_d0 = GlobalIdForSTS_INIT(&local_f0);
      std::__cxx11::ostringstream::ostringstream(local_268);
      poVar8 = std::operator<<((ostream *)local_268,"static const ");
      poVar8 = std::operator<<(poVar8,"ctemplate");
      poVar8 = std::operator<<(poVar8,"::StaticTemplateString ");
      poVar8 = std::operator<<(poVar8,(string *)
                                      (anonymous_namespace)::
                                      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                      ::prefix_abi_cxx11_);
      poVar8 = std::operator<<(poVar8,(string *)variable);
      poVar8 = std::operator<<(poVar8," = STS_INIT_WITH_HASH(");
      poVar8 = std::operator<<(poVar8,(string *)
                                      (anonymous_namespace)::
                                      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                      ::prefix_abi_cxx11_);
      poVar8 = std::operator<<(poVar8,(string *)variable);
      poVar8 = std::operator<<(poVar8,", \"");
      poVar8 = std::operator<<(poVar8,(string *)variable);
      poVar8 = std::operator<<(poVar8,"\", ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_d0);
      std::operator<<(poVar8,"ULL);\n");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::append((string *)outstring);
      std::__cxx11::string::~string(local_288);
      std::__cxx11::ostringstream::~ostringstream(local_268);
    }
    pmVar9 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_ctemplate::StringHash,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&(anonymous_namespace)::
                           WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                           ::vars_seen_abi_cxx11_,variable);
    *pmVar9 = true;
  }
  MutexLock::~MutexLock(&local_28);
  return;
LAB_0014ca17:
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&id,
                 (anonymous_namespace)::
                 WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                 ::prefix_abi_cxx11_);
  std::__cxx11::string::operator=
            ((string *)
             (anonymous_namespace)::
             WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
             ::prefix_abi_cxx11_,(string *)&id);
  std::__cxx11::string::~string((string *)&id);
  std::__cxx11::string::~string((string *)local_58);
  goto LAB_0014ca6b;
}

Assistant:

LOCKS_EXCLUDED(g_header_mutex) {
  MutexLock ml(&g_header_mutex);

  // we use hash_map instead of hash_set just to keep the stl size down
  static hash_map<string, bool, StringHash> vars_seen
      GUARDED_BY(g_header_mutex);
  static string current_file GUARDED_BY(g_header_mutex);
  static string prefix GUARDED_BY(g_header_mutex);

  if (full_pathname != current_file) {
    // changed files so re-initialize the static variables
    vars_seen.clear();
    current_file = full_pathname;

    // remove the path before the filename
    string filename(Basename(full_pathname));

    prefix = "k";
    bool take_next = true;

    for (string::size_type i = 0; i < filename.length(); i++) {
      if (filename[i] == '.') {
        // stop when we find the dot
        break;
      }
      if (take_next) {
        if (filename.substr(i, 4) == "post") {
          // stop before we process post...
          break;
        }
        prefix = prefix + filename[i];
        take_next = false;
      }
      if (filename[i] == '_') {
        take_next = true;
      }
    }
    prefix = prefix + "_";
  }

  // print out the variable, but only if we haven't seen it before.
  if (!vars_seen.count(variable)) {
    if (variable == kMainSectionName || variable.find("BI_") == 0) {
      // We don't want to write entries for __MAIN__ or the built-ins
    } else {
      const TemplateId id = GlobalIdForSTS_INIT(TemplateString(variable));
      std::ostringstream outstream;
      outstream << "static const "
                << AS_STR(GOOGLE_NAMESPACE) << "::StaticTemplateString "
                << prefix << variable << " = STS_INIT_WITH_HASH("
                << prefix << variable << ", \"" << variable << "\", "
                << id << "ULL);\n";
      outstring->append(outstream.str());
    }
    vars_seen[variable] = true;
  }
}